

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

aiVectorKey * __thiscall
comparer_context::cmp<aiVectorKey>
          (aiVectorKey *__return_storage_ptr__,comparer_context *this,string *name)

{
  double dVar1;
  aiVector3D aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  aiVector3D mValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  double local_20;
  double mTime;
  string *name_local;
  comparer_context *this_local;
  
  mTime = (double)name;
  name_local = (string *)this;
  std::operator+(&local_40,name,".mTime");
  dVar1 = cmp<double>(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_20 = dVar1;
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mTime,
                 ".mValue");
  aVar2 = cmp<aiVector3t<float>>(this,&local_78);
  mValue.x = aVar2.z;
  local_58 = aVar2._0_8_;
  std::__cxx11::string::~string((string *)&local_78);
  aiVectorKey::aiVectorKey(__return_storage_ptr__,local_20,(aiVector3D *)local_58);
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey comparer_context :: cmp<aiVectorKey >(const std::string& name)
{
    const double mTime = cmp<double>(name+".mTime");
    const aiVector3D mValue = cmp<aiVector3D>(name+".mValue");

    return aiVectorKey(mTime,mValue);
}